

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilTruth.c
# Opt level: O3

uint ** Extra_TruthElementary(int nVars)

{
  uint *puVar1;
  bool bVar2;
  uint nRows;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint **ppuVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  long lVar15;
  
  nRows = 1 << ((char)nVars - 5U & 0x1f);
  if (nVars < 6) {
    nRows = 1;
  }
  ppuVar6 = (uint **)Extra_ArrayAlloc(nVars,nRows,4);
  auVar5 = _DAT_0093e4e0;
  auVar4 = _DAT_0093d220;
  auVar3 = _DAT_0093d210;
  if (0 < nVars) {
    lVar7 = (ulong)nRows - 1;
    auVar12._8_4_ = (int)lVar7;
    auVar12._0_8_ = lVar7;
    auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar8 = 0;
    auVar12 = auVar12 ^ _DAT_0093d220;
    do {
      iVar11 = auVar12._0_4_;
      iVar13 = auVar12._4_4_;
      if (uVar8 < 5) {
        if (0 < (int)nRows) {
          uVar9 = s_VarMasks[uVar8][1];
          puVar1 = ppuVar6[uVar8];
          lVar7 = 0;
          auVar14 = auVar3;
          auVar16 = auVar5;
          do {
            auVar17 = auVar14 ^ auVar4;
            if ((bool)(~(auVar17._4_4_ == iVar13 && iVar11 < auVar17._0_4_ || iVar13 < auVar17._4_4_
                        ) & 1)) {
              *(uint *)((long)puVar1 + lVar7) = uVar9;
            }
            if ((auVar17._12_4_ != auVar12._12_4_ || auVar17._8_4_ <= auVar12._8_4_) &&
                auVar17._12_4_ <= auVar12._12_4_) {
              *(uint *)((long)puVar1 + lVar7 + 4) = uVar9;
            }
            iVar18 = SUB164(auVar16 ^ auVar4,4);
            if (iVar18 <= iVar13 && (iVar18 != iVar13 || SUB164(auVar16 ^ auVar4,0) <= iVar11)) {
              *(uint *)((long)puVar1 + lVar7 + 8) = uVar9;
              *(uint *)((long)puVar1 + lVar7 + 0xc) = uVar9;
            }
            lVar15 = auVar14._8_8_;
            auVar14._0_8_ = auVar14._0_8_ + 4;
            auVar14._8_8_ = lVar15 + 4;
            lVar15 = auVar16._8_8_;
            auVar16._0_8_ = auVar16._0_8_ + 4;
            auVar16._8_8_ = lVar15 + 4;
            lVar7 = lVar7 + 0x10;
          } while ((ulong)(nRows + 3 >> 2) << 4 != lVar7);
        }
      }
      else if (0 < (int)nRows) {
        uVar9 = 1 << ((char)uVar8 - 5U & 0x1f);
        puVar1 = ppuVar6[uVar8];
        uVar10 = 0;
        auVar17 = auVar3;
        do {
          bVar2 = iVar11 < SUB164(auVar17 ^ auVar4,0);
          iVar18 = SUB164(auVar17 ^ auVar4,4);
          if ((bool)(~(iVar13 < iVar18 || iVar18 == iVar13 && bVar2) & 1)) {
            puVar1[uVar10] = -(uint)((uVar9 & (uint)uVar10) != 0);
          }
          if (iVar13 >= iVar18 && (iVar18 != iVar13 || !bVar2)) {
            puVar1[uVar10 + 1] = -(uint)(((uint)uVar10 + 1 & uVar9) != 0);
          }
          uVar10 = uVar10 + 2;
          lVar7 = auVar17._8_8_;
          auVar17._0_8_ = auVar17._0_8_ + 2;
          auVar17._8_8_ = lVar7 + 2;
        } while ((nRows + 1 & 0xfffffffe) != uVar10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)nVars);
  }
  return ppuVar6;
}

Assistant:

unsigned ** Extra_TruthElementary( int nVars )
{
    unsigned ** pRes;
    int i, k, nWords;
    nWords = Extra_TruthWordNum(nVars);
    pRes = (unsigned **)Extra_ArrayAlloc( nVars, nWords, 4 );
    for ( i = 0; i < nVars; i++ )
    {
        if ( i < 5 )
        {
            for ( k = 0; k < nWords; k++ )
                pRes[i][k] = s_VarMasks[i][1];
        }
        else
        {
            for ( k = 0; k < nWords; k++ )
                if ( k & (1 << (i-5)) )
                    pRes[i][k] = ~(unsigned)0;
                else
                    pRes[i][k] = 0;
        }
    }
    return pRes;
}